

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O1

bool Js::CompoundString::TryAppendGeneric<Js::CompoundString::Builder<256u>>
               (char16 c,Builder<256U> *toString)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  CharCount CVar4;
  uint uVar5;
  undefined4 *puVar6;
  char16 *pcVar7;
  
  if (toString == (Builder<256U> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x355,"(toString)","toString");
    if (!bVar3) goto LAB_00d2e07a;
    *puVar6 = 0;
  }
  if (toString->isFinalized == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x356,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar3) goto LAB_00d2e07a;
    *puVar6 = 0;
  }
  if (toString->directCharLength != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x358,"(toString->HasOnlyDirectChars())",
                                "toString->HasOnlyDirectChars()");
    if (!bVar3) {
LAB_00d2e07a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  uVar1 = toString->charLength;
  CVar4 = Block::CharCapacityFromPointerCapacity(0x40);
  if (uVar1 < CVar4) {
    pcVar7 = Block::Chars(toString);
    pcVar7[uVar1] = c;
    uVar5 = toString->stringLength + 1;
    if (0x7ffffffe < uVar5) {
      Throw::OutOfMemory();
    }
    toString->stringLength = uVar5;
    toString->charLength = uVar1 + 1;
  }
  return uVar1 < CVar4;
}

Assistant:

inline bool CompoundString::TryAppendGeneric(const char16 c, String *const toString)
    {
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(toString->HasOnlyDirectChars());

        const CharCount blockCharLength = toString->LastBlockCharLength();
        if(blockCharLength < toString->LastBlockCharCapacity())
        {
            toString->LastBlockChars()[blockCharLength] = c;
            toString->SetLength(toString->GetLength() + 1);
            toString->SetLastBlockCharLength(blockCharLength + 1);
            return true;
        }
        return false;
    }